

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O1

uchar * __thiscall phosg::SHA1::SHA1(SHA1 *this,uchar *d,size_t n,uchar *md)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  size_t x;
  long lVar5;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint32_t uVar17;
  uint uVar18;
  size_t x_5;
  ulong uVar19;
  uint uVar20;
  size_t z;
  uint32_t uVar21;
  size_t x_2;
  ulong uVar22;
  StringWriter w;
  uint auStack_1b8 [4];
  size_t local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  uchar *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint auStack_138 [66];
  
  this->h[0] = 0x67452301;
  this->h[1] = 0xefcdab89;
  this->h[2] = 0x98badcfe;
  this->h[3] = 0x10325476;
  this->h[4] = 0xc3d2e1f0;
  if (n < 0x40) {
    lVar5 = 0;
  }
  else {
    uVar9 = this->h[1];
    uVar13 = 0xc3d2e1f0;
    uVar14 = 0x10325476;
    lVar16 = 0;
    uVar8 = this->h[0];
    uVar10 = this->h[2];
    do {
      auStack_1b8[3] = uVar10;
      auStack_1b8[2] = uVar8;
      local_148 = *(undefined8 *)(d + lVar16 + 0x30);
      uStack_140 = *(undefined8 *)(d + lVar16 + 0x30 + 8);
      local_158 = *(undefined8 *)(d + lVar16 + 0x20);
      uStack_150 = *(undefined8 *)(d + lVar16 + 0x20 + 8);
      local_168 = *(undefined8 *)(d + lVar16 + 0x10);
      uStack_160 = *(undefined8 *)(d + lVar16 + 0x10 + 8);
      local_178 = *(undefined8 *)(d + lVar16);
      uStack_170 = *(undefined8 *)(d + lVar16 + 8);
      lVar5 = 0;
      do {
        uVar8 = *(uint *)((long)&local_178 + lVar5 * 4);
        *(uint *)((long)&local_178 + lVar5 * 4) =
             uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar5 = 0x10;
      do {
        uVar8 = *(uint *)((long)&local_1a0._M_string_length + lVar5 * 4) ^
                *(uint *)((long)&local_1a0.field_2 + lVar5 * 4 + 0xc) ^ auStack_1b8[lVar5 + 2] ^
                auStack_1b8[lVar5];
        *(uint *)((long)&local_178 + lVar5 * 4) = uVar8 << 1 | (uint)((int)uVar8 < 0);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x50);
      uVar22 = 0;
      uVar8 = auStack_1b8[2];
      uVar4 = uVar14;
      uVar15 = uVar9;
      uVar3 = uVar13;
      uVar10 = auStack_1b8[3];
      do {
        uVar18 = uVar10;
        uVar11 = uVar4;
        uVar20 = uVar8;
        if (uVar22 < 0x14) {
          uVar8 = (uVar18 ^ uVar11) & uVar15 ^ uVar11;
          iVar12 = 0x5a827999;
        }
        else if (uVar22 < 0x28) {
          uVar8 = uVar18 ^ uVar11 ^ uVar15;
          iVar12 = 0x6ed9eba1;
        }
        else if (uVar22 < 0x3c) {
          uVar8 = uVar18 & uVar11 | (uVar18 | uVar11) & uVar15;
          iVar12 = -0x70e44324;
        }
        else {
          uVar8 = uVar18 ^ uVar11 ^ uVar15;
          iVar12 = -0x359d3e2a;
        }
        uVar8 = (uVar20 << 5 | uVar20 >> 0x1b) + uVar3 + uVar8 + iVar12 +
                *(int *)((long)&local_178 + uVar22 * 4);
        uVar10 = uVar15 << 0x1e | uVar15 >> 2;
        uVar22 = uVar22 + 1;
        uVar4 = uVar18;
        uVar15 = uVar20;
        uVar3 = uVar11;
      } while (uVar22 != 0x50);
      uVar8 = auStack_1b8[2] + uVar8;
      this->h[0] = uVar8;
      uVar9 = uVar9 + uVar20;
      this->h[1] = uVar9;
      uVar10 = auStack_1b8[3] + uVar10;
      this->h[2] = uVar10;
      uVar14 = uVar14 + uVar18;
      this->h[3] = uVar14;
      uVar13 = uVar13 + uVar11;
      this->h[4] = uVar13;
      lVar5 = lVar16 + 0x40;
      uVar22 = lVar16 + 0x7f;
      lVar16 = lVar5;
    } while (uVar22 < n);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_1a8 = n;
  local_180 = d;
  StringWriter::write((StringWriter *)&local_1a0,(int)d + (int)lVar5,(void *)(n - lVar5),
                      (size_t)local_1a0._M_dataplus._M_p);
  local_178 = CONCAT71(local_178._1_7_,0x80);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_1a0,(char *)&local_178,1);
  sVar6 = StringWriter::size((StringWriter *)&local_1a0);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_1a0,(ulong)(0x38 < sVar6) * 0x40 + 0x40,'\0');
  sVar6 = StringWriter::size((StringWriter *)&local_1a0);
  if (local_1a0._M_string_length < sVar6) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&local_1a0,sVar6,'\0');
  }
  uVar22 = local_1a8 << 3;
  *(ulong *)(local_1a0._M_dataplus._M_p + (sVar6 - 8)) =
       uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 | (uVar22 & 0xff0000000000) >> 0x18 |
       (uVar22 & 0xff00000000) >> 8 | (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
       (uVar22 & 0xff00) << 0x28 | local_1a8 << 0x3b;
  for (uVar22 = 0; sVar6 = StringWriter::size((StringWriter *)&local_1a0), uVar22 < sVar6;
      uVar22 = uVar22 + 0x40) {
    local_148 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 0x30);
    uStack_140 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 0x30 + 8);
    local_158 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 0x20);
    uStack_150 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 0x20 + 8);
    local_168 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 0x10);
    uStack_160 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 0x10 + 8);
    local_178 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22);
    uStack_170 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar22 + 8);
    lVar5 = 0;
    do {
      uVar9 = *(uint *)((long)&local_178 + lVar5 * 4);
      *(uint *)((long)&local_178 + lVar5 * 4) =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    lVar5 = 0x10;
    do {
      uVar9 = *(uint *)((long)&local_1a0._M_string_length + lVar5 * 4) ^
              *(uint *)((long)&local_1a0.field_2 + lVar5 * 4 + 0xc) ^ auStack_1b8[lVar5 + 2] ^
              auStack_1b8[lVar5];
      *(uint *)((long)&local_178 + lVar5 * 4) = uVar9 << 1 | (uint)((int)uVar9 < 0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x50);
    uVar1 = this->h[1];
    uVar2 = this->h[2];
    auStack_1b8[2] = this->h[3];
    auStack_1b8[3] = this->h[4];
    uVar19 = 0;
    uVar9 = auStack_1b8[2];
    uVar8 = auStack_1b8[3];
    uVar17 = uVar2;
    uVar21 = uVar1;
    uVar10 = this->h[0];
    do {
      uVar14 = uVar10;
      uVar15 = uVar17;
      uVar13 = uVar9;
      if (uVar19 < 0x14) {
        uVar9 = (uVar15 ^ uVar13) & uVar21 ^ uVar13;
        iVar12 = 0x5a827999;
      }
      else if (uVar19 < 0x28) {
        uVar9 = uVar15 ^ uVar13 ^ uVar21;
        iVar12 = 0x6ed9eba1;
      }
      else if (uVar19 < 0x3c) {
        uVar9 = uVar15 & uVar13 | (uVar15 | uVar13) & uVar21;
        iVar12 = -0x70e44324;
      }
      else {
        uVar9 = uVar15 ^ uVar13 ^ uVar21;
        iVar12 = -0x359d3e2a;
      }
      uVar10 = (uVar14 << 5 | uVar14 >> 0x1b) + uVar8 + uVar9 + iVar12 +
               *(int *)((long)&local_178 + uVar19 * 4);
      uVar17 = uVar21 << 0x1e | uVar21 >> 2;
      uVar19 = uVar19 + 1;
      uVar9 = uVar15;
      uVar8 = uVar13;
      uVar21 = uVar14;
    } while (uVar19 != 0x50);
    this->h[0] = uVar10 + this->h[0];
    this->h[1] = uVar14 + uVar1;
    this->h[2] = uVar17 + uVar2;
    this->h[3] = uVar15 + auStack_1b8[2];
    this->h[4] = uVar13 + auStack_1b8[3];
  }
  paVar7 = &local_1a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]) + 1);
    paVar7 = extraout_RAX;
  }
  return (uchar *)paVar7;
}

Assistant:

SHA1::SHA1(const void* data, size_t size) {
  this->h[0] = 0x67452301;
  this->h[1] = 0xEFCDAB89;
  this->h[2] = 0x98BADCFE;
  this->h[3] = 0x10325476;
  this->h[4] = 0xC3D2E1F0;

  auto process_block = [this](const void* block) -> void {
    uint32_t extended_fields[80];
    memcpy(extended_fields, block, 0x40);
#ifdef PHOSG_LITTLE_ENDIAN
    for (size_t x = 0; x < 16; x++) {
      extended_fields[x] = bswap32(extended_fields[x]);
    }
#endif

    for (size_t x = 16; x < 80; x++) {
      uint32_t z = extended_fields[x - 3] ^ extended_fields[x - 8] ^ extended_fields[x - 14] ^ extended_fields[x - 16];
      extended_fields[x] = (z << 1) | ((z >> 31) & 1);
    }

    uint32_t a = this->h[0], b = this->h[1], c = this->h[2], d = this->h[3], e = this->h[4];
    for (size_t x = 0; x < 80; x++) {
      uint32_t f, k;
      if (x < 20) {
        f = (b & c) | ((~b) & d);
        k = 0x5A827999;
      } else if (x < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (x < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }

      uint32_t new_a = ((a << 5) | ((a >> 27) & 0x1F)) + f + e + k + extended_fields[x];
      e = d;
      d = c;
      c = (b << 30) | ((b >> 2) & 0x3FFFFFFF);
      b = a;
      a = new_a;
    }

    this->h[0] += a;
    this->h[1] += b;
    this->h[2] += c;
    this->h[3] += d;
    this->h[4] += e;
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64b(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}